

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O2

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
anon_unknown.dwarf_40f3d::path_option
          (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *path)

{
  uint uVar1;
  
  uVar1 = pstore::command_line::option::get_num_occurrences(&path->super_option);
  if (uVar1 == 0) {
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x18) = 0;
  }
  else {
    pstore::maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string_const&,void>
              ((maybe<std::__cxx11::string,void> *)__return_storage_ptr__,&path->value_);
  }
  return __return_storage_ptr__;
}

Assistant:

pstore::maybe<std::string> path_option (opt<std::string> const & path) {
        if (path.get_num_occurrences () == 0U) {
            return pstore::nothing<std::string> ();
        }
        return pstore::just (path.get ());
    }